

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double sqrt(double __x)

{
  bool bVar1;
  int i;
  BigNum *in_RSI;
  BigNum *in_RDI;
  double extraout_XMM0_Qa;
  BigNum BStack_1e8;
  BigNum local_1c8;
  BigNum local_1a8;
  BigNum local_188;
  BigNum local_168;
  BigNum local_148;
  BigNum local_128;
  BigNum local_108;
  BigNum local_e8;
  BigNum local_c8;
  BigNum local_a8;
  BigNum local_88;
  BigNum local_68;
  BigNum middle;
  
  BigNum::BigNum(&local_68,1);
  BigNum::BigNum(&local_a8,in_RSI);
  BigNum::BigNum(&local_c8,4);
  operator/(&local_88,&local_a8,&local_c8);
  operator+(&middle,&local_68,&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_68);
  BigNum::BigNum(&local_e8,in_RSI);
  BigNum::BigNum(&local_108,0);
  bVar1 = operator==(&local_e8,&local_108);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e8);
  i = 0;
  if (!bVar1) {
    BigNum::BigNum(&local_128,in_RSI);
    i = 1;
    BigNum::BigNum(&local_148,1);
    bVar1 = operator==(&local_128,&local_148);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_148);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_128);
    if (!bVar1) {
      BigNum::BigNum(&local_168,2);
      BigNum::BigNum(&local_1a8,in_RSI);
      BigNum::BigNum(&local_1c8,2);
      operator/(&local_188,&local_1a8,&local_1c8);
      BigNum::BigNum(&BStack_1e8,in_RSI);
      binSearch(in_RDI,&local_168,&local_188,&BStack_1e8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&BStack_1e8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_188);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_1c8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_1a8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_168);
      goto LAB_0010403f;
    }
  }
  BigNum::BigNum(in_RDI,i);
LAB_0010403f:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&middle);
  return extraout_XMM0_Qa;
}

Assistant:

BigNum sqrt(BigNum a){
    BigNum middle = 1 + (a / 4);
    if (a == 0)
        return 0;
    if (a == 1)
        return 1;
    else
        return binSearch(BigNum(2), a / BigNum(2), a);
}